

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O1

void __thiscall
FastPForLib::
CompositeCodec<FastPForLib::NewPFor<4U,_FastPForLib::Simple16<false>_>,_FastPForLib::VariableByte>::
~CompositeCodec(CompositeCodec<FastPForLib::NewPFor<4U,_FastPForLib::Simple16<false>_>,_FastPForLib::VariableByte>
                *this)

{
  pointer puVar1;
  
  (this->super_IntegerCODEC)._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c3290;
  (this->codec1).super_IntegerCODEC._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c3300;
  puVar1 = (this->codec1).tobecoded.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->codec1).exceptions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->codec1).exceptionsValues.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->codec1).exceptionsPositions.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
    return;
  }
  return;
}

Assistant:

CompositeCodec() : codec1(), codec2() {}